

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O2

void __thiscall
Application::onMessage(Application *this,NewOrderSingle *message,SessionID *sessionID)

{
  char cVar1;
  bool bVar2;
  FieldBase *field;
  IncorrectTagValue *this_00;
  FieldBase local_708;
  double local_6b0;
  double local_6a8;
  QTY local_6a0;
  string local_698;
  string local_678;
  OrderQty orderQty;
  FieldBase local_600;
  Price price;
  OrdType ordType;
  Account account;
  ClOrdID clOrdID;
  FieldBase local_448;
  FieldBase local_3f0;
  FieldBase local_398;
  Side side;
  Symbol symbol;
  ExecutionReport executionReport;
  FieldBase local_138;
  FieldBase local_e0;
  FieldBase local_88;
  
  FIX::Symbol::Symbol(&symbol);
  FIX::Side::Side(&side);
  FIX::OrdType::OrdType(&ordType);
  FIX::OrderQty::OrderQty(&orderQty);
  FIX::Price::Price(&price);
  FIX::ClOrdID::ClOrdID(&clOrdID);
  FIX::Account::Account(&account);
  FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&ordType);
  cVar1 = FIX::CharField::getValue(&ordType.super_CharField);
  if (cVar1 == '2') {
    FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&symbol);
    FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&side);
    FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&orderQty);
    FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&price);
    FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&clOrdID);
    genOrderID_abi_cxx11_(&local_678,this);
    FIX::OrderID::OrderID((OrderID *)&local_708,&local_678);
    genExecID_abi_cxx11_(&local_698,this);
    FIX::ExecID::ExecID((ExecID *)&local_600,&local_698);
    FIX::ExecTransType::ExecTransType((ExecTransType *)&local_398,"022F11Application");
    FIX::ExecType::ExecType((ExecType *)&local_3f0,"2F11Application");
    FIX::OrdStatus::OrdStatus((OrdStatus *)&local_448,"22F11Application");
    local_6a0 = 0.0;
    FIX::LeavesQty::LeavesQty((LeavesQty *)&local_88,&local_6a0);
    local_6a8 = FIX::DoubleField::getValue(&orderQty.super_QtyField);
    FIX::CumQty::CumQty((CumQty *)&local_e0,&local_6a8);
    local_6b0 = FIX::DoubleField::getValue(&price.super_PriceField);
    FIX::AvgPx::AvgPx((AvgPx *)&local_138,&local_6b0);
    FIX42::ExecutionReport::ExecutionReport
              (&executionReport,(OrderID *)&local_708,(ExecID *)&local_600,
               (ExecTransType *)&local_398,(ExecType *)&local_3f0,(OrdStatus *)&local_448,&symbol,
               &side,(LeavesQty *)&local_88,(CumQty *)&local_e0,(AvgPx *)&local_138);
    FIX::FieldBase::~FieldBase(&local_138);
    FIX::FieldBase::~FieldBase(&local_e0);
    FIX::FieldBase::~FieldBase(&local_88);
    FIX::FieldBase::~FieldBase(&local_448);
    FIX::FieldBase::~FieldBase(&local_3f0);
    FIX::FieldBase::~FieldBase(&local_398);
    FIX::FieldBase::~FieldBase(&local_600);
    std::__cxx11::string::~string((string *)&local_698);
    FIX::FieldBase::~FieldBase(&local_708);
    std::__cxx11::string::~string((string *)&local_678);
    FIX42::ExecutionReport::set(&executionReport,&clOrdID);
    FIX42::ExecutionReport::set(&executionReport,&orderQty);
    local_600._vptr_FieldBase = (_func_int **)FIX::DoubleField::getValue(&orderQty.super_QtyField);
    FIX::LastShares::LastShares((LastShares *)&local_708,(QTY *)&local_600);
    FIX42::ExecutionReport::set(&executionReport,(LastShares *)&local_708);
    FIX::FieldBase::~FieldBase(&local_708);
    local_600._vptr_FieldBase = (_func_int **)FIX::DoubleField::getValue(&price.super_PriceField);
    FIX::LastPx::LastPx((LastPx *)&local_708,(PRICE *)&local_600);
    FIX42::ExecutionReport::set(&executionReport,(LastPx *)&local_708);
    FIX::FieldBase::~FieldBase(&local_708);
    bVar2 = FIX::FieldMap::isSetField
                      ((FieldMap *)message,account.super_StringField.super_FieldBase.m_tag);
    if (bVar2) {
      field = FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&account);
      FIX::FieldMap::setField((FieldMap *)&executionReport,field,true);
    }
    FIX::Session::sendToTarget((Message *)&executionReport,sessionID);
    FIX::Message::~Message((Message *)&executionReport);
    FIX::FieldBase::~FieldBase((FieldBase *)&account);
    FIX::FieldBase::~FieldBase((FieldBase *)&clOrdID);
    FIX::FieldBase::~FieldBase((FieldBase *)&price);
    FIX::FieldBase::~FieldBase((FieldBase *)&orderQty);
    FIX::FieldBase::~FieldBase((FieldBase *)&ordType);
    FIX::FieldBase::~FieldBase((FieldBase *)&side);
    FIX::FieldBase::~FieldBase((FieldBase *)&symbol);
    return;
  }
  this_00 = (IncorrectTagValue *)__cxa_allocate_exception(0x58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&executionReport,"",(allocator<char> *)&local_708);
  FIX::IncorrectTagValue::IncorrectTagValue
            (this_00,ordType.super_CharField.super_FieldBase.m_tag,(string *)&executionReport);
  __cxa_throw(this_00,&FIX::IncorrectTagValue::typeinfo,FIX::Exception::~Exception);
}

Assistant:

void Application::onMessage(const FIX42::NewOrderSingle &message, const FIX::SessionID &sessionID) {
  FIX::Symbol symbol;
  FIX::Side side;
  FIX::OrdType ordType;
  FIX::OrderQty orderQty;
  FIX::Price price;
  FIX::ClOrdID clOrdID;
  FIX::Account account;

  message.get(ordType);

  if (ordType != FIX::OrdType_LIMIT) {
    throw FIX::IncorrectTagValue(ordType.getTag());
  }

  message.get(symbol);
  message.get(side);
  message.get(orderQty);
  message.get(price);
  message.get(clOrdID);

  FIX42::ExecutionReport executionReport = FIX42::ExecutionReport(
      FIX::OrderID(genOrderID()),
      FIX::ExecID(genExecID()),
      FIX::ExecTransType(FIX::ExecTransType_NEW),
      FIX::ExecType(FIX::ExecType_FILL),
      FIX::OrdStatus(FIX::OrdStatus_FILLED),
      symbol,
      side,
      FIX::LeavesQty(0),
      FIX::CumQty(orderQty),
      FIX::AvgPx(price));

  executionReport.set(clOrdID);
  executionReport.set(orderQty);
  executionReport.set(FIX::LastShares(orderQty));
  executionReport.set(FIX::LastPx(price));

  if (message.isSet(account)) {
    executionReport.setField(message.get(account));
  }

  try {
    FIX::Session::sendToTarget(executionReport, sessionID);
  } catch (FIX::SessionNotFound &) {}
}